

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_zip.c
# Opt level: O1

wchar_t archive_read_format_zip_seekable_read_header(archive_read *a,archive_entry *entry)

{
  char cVar1;
  byte bVar2;
  ushort uVar3;
  ushort uVar4;
  zip *pzVar5;
  uLong uVar6;
  bool bVar7;
  bool bVar8;
  Bytef *pBVar9;
  uint16_t uVar10;
  wchar_t wVar11;
  wchar_t wVar12;
  int iVar13;
  void *pvVar14;
  time_t tVar15;
  ulong name_length;
  zip_entry *pzVar16;
  archive_rb_node *paVar17;
  la_int64_t lVar18;
  long lVar19;
  int *piVar20;
  Bytef *__src;
  char *__s;
  long request;
  uint direction;
  uchar *puVar21;
  char *pcVar22;
  int64_t iVar23;
  archive_rb_tree *rbt;
  char *p;
  archive_string *as;
  archive_rb_node *request_00;
  archive_rb_tree *paVar24;
  archive_rb_node *paVar25;
  ssize_t bytes_avail;
  archive_rb_node *local_78;
  archive_rb_node *local_70;
  Bytef *local_68;
  char *local_60;
  zip *local_58;
  archive_rb_node *local_50;
  archive_rb_tree *local_48;
  archive_entry *local_40;
  z_streamp local_38;
  
  pzVar5 = (zip *)a->format->data;
  if (pzVar5->has_encrypted_entries == -1) {
    pzVar5->has_encrypted_entries = 0;
  }
  (a->archive).archive_format = 0x50000;
  if ((a->archive).archive_format_name == (char *)0x0) {
    (a->archive).archive_format_name = "ZIP";
  }
  if (pzVar5->zip_entries == (zip_entry *)0x0) {
    bVar7 = false;
    local_40 = entry;
    iVar23 = __archive_read_seek(a,pzVar5->central_directory_offset,0);
    wVar12 = L'\xffffffe2';
    if (-1 < iVar23) {
      pvVar14 = __archive_read_ahead(a,0x14,(ssize_t *)&local_70);
      if (pvVar14 != (void *)0x0) {
        do {
          if ((long)local_70 < 5) {
            __archive_read_consume(a,0);
          }
          else {
            iVar23 = 0;
            bVar7 = false;
            do {
              cVar1 = *(char *)((long)pvVar14 + iVar23 + 3);
              switch(cVar1) {
              case '\x02':
                if (*(int *)((long)pvVar14 + iVar23) != 0x2014b50) goto switchD_004135b9_caseD_3;
LAB_00413602:
                pvVar14 = (void *)((long)pvVar14 + iVar23);
                bVar7 = true;
                break;
              case '\x03':
              case '\x04':
switchD_004135b9_caseD_3:
                iVar23 = iVar23 + 4;
                break;
              case '\x06':
                if ((*(int *)((long)pvVar14 + iVar23) == 0x6054b50) ||
                   (*(int *)((long)pvVar14 + iVar23) == 0x6064b50)) goto LAB_00413602;
              case '\x01':
              case '\x05':
                iVar23 = iVar23 + 1;
                break;
              default:
                if (cVar1 == 'P') {
                  iVar23 = iVar23 + 3;
                }
                else {
                  if (cVar1 != 'K') goto switchD_004135b9_caseD_3;
                  iVar23 = iVar23 + 2;
                }
              }
            } while ((!bVar7) && (iVar23 < (long)((long)&local_70[-1].rb_info + 4)));
            __archive_read_consume(a,iVar23);
            if (bVar7) {
              lVar18 = archive_filter_bytes(&a->archive,0);
              local_50 = (archive_rb_node *)(lVar18 - pzVar5->central_directory_offset);
              paVar24 = &pzVar5->tree;
              __archive_rb_tree_init(paVar24,&rb_ops);
              local_48 = &pzVar5->tree_rsrc;
              __archive_rb_tree_init(local_48,&rb_rsrc_ops);
              pzVar5->central_directory_entries_total = 0;
              goto LAB_00413695;
            }
          }
          pvVar14 = __archive_read_ahead(a,0x14,(ssize_t *)&local_70);
        } while (pvVar14 != (void *)0x0);
      }
      goto LAB_00413a1c;
    }
    goto LAB_00413a1f;
  }
  pzVar16 = pzVar5->entry;
  if (pzVar16 != (zip_entry *)0x0) {
    direction = 1;
    goto LAB_00413a35;
  }
  goto LAB_00413a3e;
LAB_00413695:
  do {
    piVar20 = (int *)__archive_read_ahead(a,4,(ssize_t *)0x0);
    if (piVar20 == (int *)0x0) goto LAB_004136d8;
    iVar13 = 8;
    if ((*piVar20 == 0x6064b50) || (*piVar20 == 0x6054b50)) goto LAB_004136dd;
    if (*piVar20 == 0x2014b50) {
      pvVar14 = __archive_read_ahead(a,0x2e,(ssize_t *)0x0);
      if (pvVar14 == (void *)0x0) goto LAB_004136d8;
      pzVar16 = (zip_entry *)calloc(1,0x90);
      pzVar16->next = pzVar5->zip_entries;
      pzVar16->flags = pzVar16->flags | 2;
      pzVar5->zip_entries = pzVar16;
      pzVar5->central_directory_entries_total = pzVar5->central_directory_entries_total + 1;
      pzVar16->system = *(uchar *)((long)pvVar14 + 5);
      bVar2 = *(byte *)((long)pvVar14 + 8);
      pzVar16->zip_flags = *(uint16_t *)((long)pvVar14 + 8);
      if ((bVar2 & 0x41) != 0) {
        pzVar5->has_encrypted_entries = 1;
      }
      pzVar16->compression = *(uchar *)((long)pvVar14 + 10);
      tVar15 = zip_time((char *)((long)pvVar14 + 0xc));
      pzVar16->mtime = tVar15;
      pzVar16->cm_zlib_crc32 = *(uint32_t *)((long)pvVar14 + 0x10);
      puVar21 = (uchar *)((long)pvVar14 + 0x13);
      if ((pzVar16->zip_flags & 8) != 0) {
        puVar21 = (uchar *)((long)pvVar14 + 0xd);
      }
      pzVar16->decdat = *puVar21;
      pzVar16->compressed_size = (ulong)*(uint *)((long)pvVar14 + 0x14);
      pzVar16->uncompressed_size = (ulong)*(uint *)((long)pvVar14 + 0x18);
      uVar3 = *(ushort *)((long)pvVar14 + 0x1c);
      name_length = (ulong)uVar3;
      uVar4 = *(ushort *)((long)pvVar14 + 0x1e);
      local_68 = (Bytef *)(ulong)*(ushort *)((long)pvVar14 + 0x20);
      uVar10 = *(uint16_t *)((long)pvVar14 + 0x28);
      bVar2 = *(byte *)((long)pvVar14 + 0x26);
      pzVar16->local_header_offset =
           (long)local_50->rb_nodes + (ulong)*(uint *)((long)pvVar14 + 0x2a);
      if (pzVar16->system == '\0') {
        uVar10 = 0x41fd;
        if ((bVar2 & 0x10) == 0) {
          uVar10 = 0x81b4;
        }
        pzVar16->mode = uVar10;
        if ((bVar2 & 1) != 0) {
          pzVar16->mode = pzVar16->mode & 0x16d;
        }
      }
      else if (pzVar16->system == '\x03') {
        pzVar16->mode = uVar10;
      }
      else {
        pzVar16->mode = 0;
      }
      __archive_read_consume(a,0x2e);
      local_58 = (zip *)(uVar4 + name_length);
      pcVar22 = (char *)__archive_read_ahead(a,(size_t)local_58,(ssize_t *)0x0);
      if (pcVar22 == (char *)0x0) {
        archive_set_error(&a->archive,0x54,"Truncated ZIP file header");
        iVar13 = 1;
      }
      else {
        p = pcVar22 + name_length;
        local_60 = pcVar22;
        wVar11 = process_extra(a,p,(ulong)uVar4,pzVar16);
        iVar13 = 1;
        if (wVar11 == L'\0') {
          pcVar22 = local_60;
          if (pzVar5->process_mac_extensions == 0) {
            __archive_rb_tree_insert_node(paVar24,(archive_rb_node *)pzVar16);
          }
          else {
            do {
              __s = pcVar22;
              pvVar14 = memchr(__s,0x2f,(long)p - (long)__s);
              pcVar22 = (char *)((long)pvVar14 + 1);
            } while (pvVar14 != (void *)0x0);
            if ((uVar3 < 9) ||
               (iVar13 = strncmp("__MACOSX/",local_60,9), pcVar22 = local_60, iVar13 != 0)) {
              as = &pzVar16->rsrcname;
              (pzVar16->rsrcname).length = 0;
              archive_strncat(as,"__MACOSX/",9);
              local_38 = (z_streamp)((long)__s - (long)local_60);
              archive_strncat(as,local_60,(size_t)local_38);
              archive_strcat(as,"._");
              archive_strncat(as,__s,name_length - (long)local_38);
              rbt = paVar24;
            }
            else {
              if ((p[-1] != '/') &&
                 ((((long)__s - (long)local_60 < 3 || (*__s != '.')) || (__s[1] != '_')))) {
                __archive_rb_tree_insert_node(paVar24,(archive_rb_node *)pzVar16);
                expose_parent_dirs(pzVar5,pcVar22,name_length);
                goto LAB_00413985;
              }
              (pzVar16->rsrcname).length = 0;
              archive_strncat(&pzVar16->rsrcname,local_60,name_length);
              rbt = local_48;
            }
            __archive_rb_tree_insert_node(rbt,(archive_rb_node *)pzVar16);
          }
LAB_00413985:
          __archive_read_consume(a,(long)local_68 + (long)local_58);
          iVar13 = 0;
        }
      }
    }
    else {
      archive_set_error(&a->archive,-1,"Invalid central directory signature");
LAB_004136d8:
      iVar13 = 1;
    }
LAB_004136dd:
  } while (iVar13 == 0);
  if (iVar13 == 8) {
    wVar12 = L'\0';
    bVar7 = true;
  }
  else {
LAB_00413a1c:
    bVar7 = false;
  }
LAB_00413a1f:
  if (!bVar7) {
    return wVar12;
  }
  pzVar16 = (zip_entry *)0x0;
  direction = 0;
  entry = local_40;
LAB_00413a35:
  pzVar16 = (zip_entry *)__archive_rb_tree_iterate(&pzVar5->tree,&pzVar16->node,direction);
  pzVar5->entry = pzVar16;
LAB_00413a3e:
  if (pzVar5->entry == (zip_entry *)0x0) {
    return L'\x01';
  }
  pcVar22 = (pzVar5->entry->rsrcname).s;
  if (pcVar22 == (char *)0x0) {
    paVar17 = (archive_rb_node *)0x0;
  }
  else {
    paVar17 = __archive_rb_tree_find_node(&pzVar5->tree_rsrc,pcVar22);
  }
  if (pzVar5->cctx_valid != '\0') {
    aes_ctr_release(&pzVar5->cctx);
  }
  if (pzVar5->hctx_valid != '\0') {
    __hmac_sha1_cleanup(&pzVar5->hctx);
  }
  pzVar5->hctx_valid = '\0';
  pzVar5->cctx_valid = '\0';
  pzVar5->tctx_valid = '\0';
  __archive_read_reset_passphrase(a);
  lVar18 = archive_filter_bytes(&a->archive,0);
  lVar19 = pzVar5->entry->local_header_offset;
  request = lVar19 - lVar18;
  if (request == 0 || lVar19 < lVar18) {
    if (request != 0) {
      __archive_read_seek(a,lVar19,0);
    }
  }
  else {
    __archive_read_consume(a,request);
  }
  pzVar5->unconsumed = 0;
  wVar12 = zip_read_local_file_header(a,entry,pzVar5);
  if (wVar12 != L'\0') {
    return wVar12;
  }
  if (paVar17 == (archive_rb_node *)0x0) {
    return L'\0';
  }
  pzVar5 = (zip *)a->format->data;
  lVar18 = archive_filter_bytes(&a->archive,0);
  bVar2 = *(byte *)(paVar17[5].rb_nodes + 1);
  if (bVar2 == 8) {
LAB_00413b51:
    paVar25 = paVar17[2].rb_nodes[0];
    if ((long)paVar25 < 0x400001) {
      if ((long)paVar17[1].rb_info < 0x400001) {
        local_48 = (archive_rb_tree *)malloc((size_t)paVar25);
        if (local_48 == (archive_rb_tree *)0x0) {
          pcVar22 = "Can\'t allocate memory for Mac metadata";
          iVar13 = 0xc;
          local_48 = (archive_rb_tree *)0x0;
          goto LAB_00413c26;
        }
        paVar25 = paVar17[1].rb_nodes[1];
        lVar19 = (long)paVar25 - lVar18;
        if (lVar19 == 0 || (long)paVar25 < lVar18) {
          if (lVar19 != 0) {
            __archive_read_seek(a,(int64_t)paVar25,0);
          }
        }
        else {
          __archive_read_consume(a,lVar19);
        }
        piVar20 = (int *)__archive_read_ahead(a,0x1e,(ssize_t *)0x0);
        local_60 = (char *)lVar18;
        if (piVar20 == (int *)0x0) {
          pcVar22 = "Truncated ZIP file header";
          iVar13 = 0x54;
LAB_00413c9a:
          archive_set_error(&a->archive,iVar13,pcVar22);
          iVar23 = -0x14;
        }
        else {
          if (*piVar20 != 0x4034b50) {
            pcVar22 = "Damaged Zip archive";
            iVar13 = -1;
            goto LAB_00413c9a;
          }
          iVar23 = (ulong)*(ushort *)((long)piVar20 + 0x1a) + (ulong)*(ushort *)(piVar20 + 7) + 0x1e
          ;
        }
        __archive_read_consume(a,iVar23);
        paVar25 = (archive_rb_node *)paVar17[1].rb_info;
        local_78 = paVar17[2].rb_nodes[0];
        local_38 = &pzVar5->stream;
        wVar12 = L'\0';
        bVar7 = false;
        local_68 = (Bytef *)local_48;
        local_58 = pzVar5;
        local_40 = entry;
        do {
          paVar24 = local_48;
          if ((bVar7) || (paVar25 == (archive_rb_node *)0x0)) {
            archive_entry_copy_mac_metadata
                      (local_40,local_48,(long)paVar17[2].rb_nodes[0] - (long)local_78);
            goto LAB_00413f21;
          }
          __src = (Bytef *)__archive_read_ahead(a,1,(ssize_t *)&local_70);
          pzVar5 = local_58;
          pBVar9 = local_68;
          if (__src == (Bytef *)0x0) {
            archive_set_error(&a->archive,0x54,"Truncated ZIP file header");
            iVar13 = 5;
            wVar12 = L'\xffffffec';
          }
          else {
            if (paVar25 < local_70) {
              local_70 = paVar25;
            }
            if (*(char *)(paVar17[5].rb_nodes + 1) == '\b') {
              bVar7 = false;
              wVar12 = zip_deflate_init(a,local_58);
              pBVar9 = local_68;
              if (wVar12 == L'\0') {
                (pzVar5->stream).next_in = __src;
                (pzVar5->stream).avail_in = (uInt)local_70;
                (pzVar5->stream).total_in = 0;
                (pzVar5->stream).next_out = local_68;
                (pzVar5->stream).avail_out = (uInt)local_78;
                (pzVar5->stream).total_out = 0;
                iVar13 = cm_zlib_inflate(local_38,0);
                if (iVar13 == -4) {
                  archive_set_error(&a->archive,0xc,"Out of memory for ZIP decompression");
LAB_00413eb6:
                  bVar8 = false;
                  wVar12 = L'\xffffffe2';
                }
                else {
                  if (iVar13 != 0) {
                    if (iVar13 != 1) {
                      archive_set_error(&a->archive,-1,"ZIP decompression failed (%d)");
                      goto LAB_00413eb6;
                    }
                    bVar7 = true;
                  }
                  local_50 = (archive_rb_node *)(pzVar5->stream).total_in;
                  uVar6 = (pzVar5->stream).total_out;
                  local_78 = (archive_rb_node *)((long)local_78 - uVar6);
                  local_68 = pBVar9 + uVar6;
                  bVar8 = true;
                  wVar12 = L'\0';
                }
              }
              else {
                bVar8 = false;
              }
              iVar13 = 5;
              request_00 = local_50;
              if (!bVar8) goto LAB_00413ee4;
            }
            else if (*(char *)(paVar17[5].rb_nodes + 1) == '\0') {
              if (local_78 < local_70) {
                local_70 = local_78;
              }
              local_50 = paVar25;
              memcpy(local_68,__src,(size_t)local_70);
              local_68 = pBVar9 + (long)local_70;
              local_78 = (archive_rb_node *)((long)local_78 - (long)local_70);
              request_00 = local_70;
              paVar25 = local_50;
              if (local_78 == (archive_rb_node *)0x0) {
                bVar7 = true;
              }
            }
            else {
              request_00 = (archive_rb_node *)0x0;
            }
            __archive_read_consume(a,(int64_t)request_00);
            paVar25 = (archive_rb_node *)((long)paVar25 - (long)request_00);
            iVar13 = 0;
            local_50 = request_00;
          }
LAB_00413ee4:
        } while (iVar13 == 0);
        paVar24 = local_48;
        if (iVar13 == 5) {
LAB_00413f21:
          __archive_read_seek(a,(int64_t)local_60,0);
          local_58->decompress_init = '\0';
          free(paVar24);
        }
        goto LAB_00413c33;
      }
      pcVar22 = "Mac metadata is too large: %jd > 4M bytes";
      paVar25 = (archive_rb_node *)paVar17[1].rb_info;
    }
    else {
      pcVar22 = "Mac metadata is too large: %jd > 4M bytes";
    }
  }
  else {
    if (bVar2 == 0) {
      if (paVar17[2].rb_nodes[0] == (archive_rb_node *)paVar17[1].rb_info) goto LAB_00413b51;
      pcVar22 = "Malformed OS X metadata entry: inconsistent size";
      iVar13 = 0x54;
LAB_00413c26:
      archive_set_error(&a->archive,iVar13,pcVar22);
      wVar12 = L'\xffffffe2';
      goto LAB_00413c33;
    }
    lVar19 = 8;
    paVar25 = (archive_rb_node *)0x53409c;
    do {
      if (*(uint *)((long)&PTR_bid_keyword_keys_u_00636348 + lVar19) == (uint)bVar2) {
        paVar25 = *(archive_rb_node **)((long)&compression_methods[0].id + lVar19);
        break;
      }
      lVar19 = lVar19 + 0x10;
    } while (lVar19 != 0x178);
    pcVar22 = "Unsupported ZIP compression method (%s)";
  }
  archive_set_error(&a->archive,0x54,pcVar22,paVar25);
  wVar12 = L'\xffffffec';
LAB_00413c33:
  return wVar12 >> 0x1f & wVar12;
}

Assistant:

static int
archive_read_format_zip_seekable_read_header(struct archive_read *a,
	struct archive_entry *entry)
{
	struct zip *zip = (struct zip *)a->format->data;
	struct zip_entry *rsrc;
	int64_t offset;
	int r, ret = ARCHIVE_OK;

	/*
	 * It should be sufficient to call archive_read_next_header() for
	 * a reader to determine if an entry is encrypted or not. If the
	 * encryption of an entry is only detectable when calling
	 * archive_read_data(), so be it. We'll do the same check there
	 * as well.
	 */
	if (zip->has_encrypted_entries ==
			ARCHIVE_READ_FORMAT_ENCRYPTION_DONT_KNOW)
		zip->has_encrypted_entries = 0;

	a->archive.archive_format = ARCHIVE_FORMAT_ZIP;
	if (a->archive.archive_format_name == NULL)
		a->archive.archive_format_name = "ZIP";

	if (zip->zip_entries == NULL) {
		r = slurp_central_directory(a, zip);
		if (r != ARCHIVE_OK)
			return r;
		/* Get first entry whose local header offset is lower than
		 * other entries in the archive file. */
		zip->entry =
		    (struct zip_entry *)ARCHIVE_RB_TREE_MIN(&zip->tree);
	} else if (zip->entry != NULL) {
		/* Get next entry in local header offset order. */
		zip->entry = (struct zip_entry *)__archive_rb_tree_iterate(
		    &zip->tree, &zip->entry->node, ARCHIVE_RB_DIR_RIGHT);
	}

	if (zip->entry == NULL)
		return ARCHIVE_EOF;

	if (zip->entry->rsrcname.s)
		rsrc = (struct zip_entry *)__archive_rb_tree_find_node(
		    &zip->tree_rsrc, zip->entry->rsrcname.s);
	else
		rsrc = NULL;

	if (zip->cctx_valid)
		archive_decrypto_aes_ctr_release(&zip->cctx);
	if (zip->hctx_valid)
		archive_hmac_sha1_cleanup(&zip->hctx);
	zip->tctx_valid = zip->cctx_valid = zip->hctx_valid = 0;
	__archive_read_reset_passphrase(a);

	/* File entries are sorted by the header offset, we should mostly
	 * use __archive_read_consume to advance a read point to avoid redundant
	 * data reading.  */
	offset = archive_filter_bytes(&a->archive, 0);
	if (offset < zip->entry->local_header_offset)
		__archive_read_consume(a,
		    zip->entry->local_header_offset - offset);
	else if (offset != zip->entry->local_header_offset) {
		__archive_read_seek(a, zip->entry->local_header_offset,
		    SEEK_SET);
	}
	zip->unconsumed = 0;
	r = zip_read_local_file_header(a, entry, zip);
	if (r != ARCHIVE_OK)
		return r;
	if (rsrc) {
		int ret2 = zip_read_mac_metadata(a, entry, rsrc);
		if (ret2 < ret)
			ret = ret2;
	}
	return (ret);
}